

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportjson.cpp
# Opt level: O3

string * __thiscall
trun::ResultsReportJSON::EscapeString
          (string *__return_storage_ptr__,ResultsReportJSON *this,string *str)

{
  char __c;
  size_type sVar1;
  pointer pcVar2;
  long *plVar3;
  void *pvVar4;
  size_type sVar5;
  string strIllegal;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\"\\","");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = str->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (str->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      plVar3 = local_50;
      __c = pcVar2[sVar5];
      if (0x1e < __c) {
        if (local_48 != 0) {
          pvVar4 = memchr(local_50,(int)__c,local_48);
          if ((long)pvVar4 - (long)plVar3 != -1 && pvVar4 != (void *)0x0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(__return_storage_ptr__,'\\');
          }
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,__c);
      }
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ResultsReportJSON::EscapeString(const std::string &str) {
    std::string strIllegal = "\"\\";
    std::string strEscaped;
    for(auto c : str) {
        // Just skip this - we do not forward tab's, bells, new lines and whatever...
        if (c < 31) continue;
        if (strIllegal.find(c) != std::string::npos) {
            strEscaped += '\\';
        }
        strEscaped += c;
    }

    return strEscaped;
}